

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  cmSourceGroup *pcVar3;
  pointer this_00;
  
  this_00 = (this->Internal->GroupChildren).
            super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pcVar1) {
      bVar2 = cmsys::RegularExpression::find(&this->GroupRegex,name);
      if (!bVar2) {
        return (cmSourceGroup *)0x0;
      }
      return this;
    }
    pcVar3 = MatchChildrenRegex(this_00,name);
    this_00 = this_00 + 1;
  } while (pcVar3 == (cmSourceGroup *)0x0);
  return pcVar3;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenRegex(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenRegex(name);
    if (result) {
      return result;
    }
  }
  if (this->MatchesRegex(name)) {
    return this;
  }

  return nullptr;
}